

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_substring_rangeBeyondBounds_fn(int _i)

{
  int iVar1;
  AString *pAVar2;
  uint uVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char *pcVar6;
  char *__s2;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"abcd01234567wxyz",0x10);
  private_ACUtilsTest_AString_reallocFail = 0;
  pAVar2 = AString_substring(&string,0,0x11);
  if (pAVar2 == (AString *)0x0) {
    string.size = 0;
    __s2 = (char *)0x0;
    expr = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar5 = "(void*) substring != NULL";
    pcVar6 = "(void*) substring";
    iVar1 = 0x9a1;
    goto LAB_0014e37b;
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x9a1);
  if ((char *)pAVar2->capacity == (char *)0x10) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x9a2);
    if (pAVar2->buffer == (char *)0x0) {
      __s2 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar5 = "(void*) (*substring).buffer != NULL";
      pcVar6 = "(void*) (*substring).buffer";
      string.size = (size_t)(char *)0x0;
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x9a2);
      __s2 = pAVar2->buffer;
      if ((byte *)__s2 == (byte *)0x0) {
        string.size = 0x16819b;
        __s2 = "(null)";
      }
      else {
        iVar1 = strcmp("abcd01234567wxyz",__s2);
        if (iVar1 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9a2);
          if ((char *)pAVar2->size != (char *)0x10) {
            __s2 = "strlen(\"abcd01234567wxyz\")";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "(*substring).size == strlen(\"abcd01234567wxyz\")";
            pcVar6 = "(*substring).size";
            string.size = pAVar2->size;
            goto LAB_0014da60;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x9a2);
          if (string.capacity == 0x10) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x9a3);
            if (string.buffer == (char *)0x0) {
              string.size = 0;
              __s2 = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
              pcVar5 = "(void*) (string).buffer != NULL";
              pcVar6 = "(void*) (string).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x9a3);
              __s2 = string.buffer;
              if (string.buffer == (char *)0x0) {
                string.size = 0x16819b;
                __s2 = "(null)";
              }
              else {
                iVar1 = strcmp("abcd01234567wxyz",string.buffer);
                if (iVar1 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9a3);
                  if (string.size != 0x10) {
                    __s2 = "strlen(\"abcd01234567wxyz\")";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar5 = "(string).size == strlen(\"abcd01234567wxyz\")";
                    pcVar6 = "(string).size";
                    goto LAB_0014db94;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9a3);
                  AString_destruct(pAVar2);
                  pAVar2 = AString_substring(&string,0,0xffffffffffffffff);
                  if (pAVar2 == (AString *)0x0) {
                    string.size = 0;
                    __s2 = (char *)0x0;
                    expr = "Assertion \'_ck_x != NULL\' failed";
                    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                    pcVar5 = "(void*) substring != NULL";
                    pcVar6 = "(void*) substring";
                    iVar1 = 0x9a6;
                    goto LAB_0014e37b;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x9a6);
                  if ((char *)pAVar2->capacity == (char *)0x10) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x9a7);
                    if (pAVar2->buffer == (char *)0x0) {
                      __s2 = (char *)0x0;
                      expr = "Assertion \'_ck_x != NULL\' failed";
                      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                      pcVar5 = "(void*) (*substring).buffer != NULL";
                      pcVar6 = "(void*) (*substring).buffer";
                      string.size = (size_t)(char *)0x0;
                    }
                    else {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x9a7);
                      __s2 = pAVar2->buffer;
                      if ((byte *)__s2 == (byte *)0x0) {
                        string.size = 0x16819b;
                        __s2 = "(null)";
                      }
                      else {
                        iVar1 = strcmp("abcd01234567wxyz",__s2);
                        if (iVar1 == 0) {
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x9a7);
                          if ((char *)pAVar2->size != (char *)0x10) {
                            __s2 = "strlen(\"abcd01234567wxyz\")";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar5 = "(*substring).size == strlen(\"abcd01234567wxyz\")";
                            pcVar6 = "(*substring).size";
                            string.size = pAVar2->size;
                            goto LAB_0014dcfc;
                          }
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x9a7);
                          if (string.capacity == 0x10) {
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0x9a8);
                            if (string.buffer == (char *)0x0) {
                              string.size = 0;
                              __s2 = (char *)0x0;
                              expr = "Assertion \'_ck_x != NULL\' failed";
                              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                              pcVar5 = "(void*) (string).buffer != NULL";
                              pcVar6 = "(void*) (string).buffer";
                            }
                            else {
                              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0x9a8);
                              __s2 = string.buffer;
                              if (string.buffer == (char *)0x0) {
                                string.size = 0x16819b;
                                __s2 = "(null)";
                              }
                              else {
                                iVar1 = strcmp("abcd01234567wxyz",string.buffer);
                                if (iVar1 == 0) {
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x9a8);
                                  if (string.size != 0x10) {
                                    __s2 = "strlen(\"abcd01234567wxyz\")";
                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                    pcVar5 = "(string).size == strlen(\"abcd01234567wxyz\")";
                                    pcVar6 = "(string).size";
                                    goto LAB_0014de30;
                                  }
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x9a8);
                                  AString_destruct(pAVar2);
                                  pAVar2 = AString_substring(&string,8,0xffffffffffffffff);
                                  if (pAVar2 == (AString *)0x0) {
                                    string.size = 0;
                                    __s2 = (char *)0x0;
                                    expr = "Assertion \'_ck_x != NULL\' failed";
                                    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                                    pcVar5 = "(void*) substring != NULL";
                                    pcVar6 = "(void*) substring";
                                    iVar1 = 0x9ab;
                                    goto LAB_0014e37b;
                                  }
                                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                              ,0x9ab);
                                  if ((char *)pAVar2->capacity == (char *)0x8) {
                                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                ,0x9ac);
                                    if (pAVar2->buffer == (char *)0x0) {
                                      __s2 = (char *)0x0;
                                      expr = "Assertion \'_ck_x != NULL\' failed";
                                      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                                      pcVar5 = "(void*) (*substring).buffer != NULL";
                                      pcVar6 = "(void*) (*substring).buffer";
                                      string.size = (size_t)(char *)0x0;
                                    }
                                    else {
                                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9ac);
                                      __s2 = pAVar2->buffer;
                                      if ((byte *)__s2 == (byte *)0x0) {
                                        string.size = 0x16819b;
                                        __s2 = "(null)";
                                      }
                                      else {
                                        iVar1 = strcmp("4567wxyz",__s2);
                                        if (iVar1 == 0) {
                                          _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9ac);
                                          if ((char *)pAVar2->size != (char *)0x8) {
                                            __s2 = "strlen(\"4567wxyz\")";
                                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                                            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju"
                                            ;
                                            pcVar5 = "(*substring).size == strlen(\"4567wxyz\")";
                                            pcVar6 = "(*substring).size";
                                            string.size = pAVar2->size;
                                            goto LAB_0014df9f;
                                          }
                                          _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9ac);
                                          if (string.capacity == 0x10) {
                                            _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9ad);
                                            if (string.buffer == (char *)0x0) {
                                              string.size = 0;
                                              __s2 = (char *)0x0;
                                              expr = "Assertion \'_ck_x != NULL\' failed";
                                              pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                                              pcVar5 = "(void*) (string).buffer != NULL";
                                              pcVar6 = "(void*) (string).buffer";
                                            }
                                            else {
                                              _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9ad);
                                              __s2 = string.buffer;
                                              if (string.buffer == (char *)0x0) {
                                                __s2 = "(null)";
                                                string.size = 0x16819b;
                                              }
                                              else {
                                                iVar1 = strcmp("abcd01234567wxyz",string.buffer);
                                                if (iVar1 == 0) {
                                                  _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9ad);
                                                  if (string.size != 0x10) {
                                                    __s2 = "strlen(\"abcd01234567wxyz\")";
                                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                                    pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                                  pcVar5 = 
                                                  "(string).size == strlen(\"abcd01234567wxyz\")";
                                                  pcVar6 = "(string).size";
                                                  goto LAB_0014e0d3;
                                                  }
                                                  _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9ad);
                                                  AString_destruct(pAVar2);
                                                  pAVar2 = AString_substring(&string,0xf,0x29a);
                                                  if (pAVar2 == (AString *)0x0) {
                                                    string.size = 0;
                                                    __s2 = (char *)0x0;
                                                    expr = "Assertion \'_ck_x != NULL\' failed";
                                                    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                                                    pcVar5 = "(void*) substring != NULL";
                                                    pcVar6 = "(void*) substring";
                                                    iVar1 = 0x9b0;
                                                    goto LAB_0014e37b;
                                                  }
                                                  _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9b0);
                                                  if ((char *)pAVar2->capacity == (char *)0x8) {
                                                    _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9b1);
                                                  if (pAVar2->buffer == (char *)0x0) {
                                                    __s2 = (char *)0x0;
                                                    expr = "Assertion \'_ck_x != NULL\' failed";
                                                    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                                                    pcVar5 = "(void*) (*substring).buffer != NULL";
                                                    pcVar6 = "(void*) (*substring).buffer";
                                                    string.size = (size_t)(char *)0x0;
                                                  }
                                                  else {
                                                    _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9b1);
                                                  __s2 = pAVar2->buffer;
                                                  if ((byte *)__s2 == (byte *)0x0) {
                                                    __s2 = "(null)";
                                                    string.size = 0x16819b;
                                                  }
                                                  else {
                                                    uVar3 = (byte)*__s2 - 0x7a;
                                                    if (uVar3 == 0) {
                                                      uVar3 = (uint)((byte *)__s2)[1];
                                                    }
                                                    if (uVar3 == 0) {
                                                      _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9b1);
                                                  if ((char *)pAVar2->size != (char *)0x1) {
                                                    __s2 = "strlen(\"z\")";
                                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                                    pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                                  pcVar5 = "(*substring).size == strlen(\"z\")";
                                                  pcVar6 = "(*substring).size";
                                                  string.size = pAVar2->size;
                                                  goto LAB_0014e242;
                                                  }
                                                  _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9b1);
                                                  if (string.capacity == 0x10) {
                                                    _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9b2);
                                                  if (string.buffer == (char *)0x0) {
                                                    string.size = 0;
                                                    __s2 = (char *)0x0;
                                                    expr = "Assertion \'_ck_x != NULL\' failed";
                                                    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
                                                    pcVar5 = "(void*) (string).buffer != NULL";
                                                    pcVar6 = "(void*) (string).buffer";
                                                  }
                                                  else {
                                                    _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9b2);
                                                  __s2 = string.buffer;
                                                  if (string.buffer == (char *)0x0) {
                                                    __s2 = "(null)";
                                                    string.size = 0x16819b;
                                                  }
                                                  else {
                                                    iVar1 = strcmp("abcd01234567wxyz",string.buffer)
                                                    ;
                                                    if (iVar1 == 0) {
                                                      _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9b2);
                                                  if (string.size == 0x10) {
                                                    _mark_point(
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                                  ,0x9b2);
                                                  AString_destruct(pAVar2);
                                                  (*string.deallocator)(string.buffer);
                                                  return;
                                                  }
                                                  __s2 = "strlen(\"abcd01234567wxyz\")";
                                                  expr = "Assertion \'_ck_x == _ck_y\' failed";
                                                  pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                                  pcVar5 = 
                                                  "(string).size == strlen(\"abcd01234567wxyz\")";
                                                  pcVar6 = "(string).size";
                                                  goto LAB_0014e376;
                                                  }
                                                  string.size = 0x15c553;
                                                  }
                                                  expr = 
                                                  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                                  ;
                                                  pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s"
                                                  ;
                                                  pcVar5 = 
                                                  "(string).buffer == (\"abcd01234567wxyz\")";
                                                  pcVar6 = "(string).buffer";
                                                  }
                                                  }
                                                  else {
                                                    __s2 = "(16)";
                                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                                    pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                                  pcVar5 = "(string).capacity == (16)";
                                                  pcVar6 = "(string).capacity";
                                                  string.size = string.capacity;
                                                  }
LAB_0014e376:
                                                  iVar1 = 0x9b2;
                                                  goto LAB_0014e37b;
                                                  }
                                                  string.size = 0x15c553;
                                                  }
                                                  expr = 
                                                  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                                  ;
                                                  pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s"
                                                  ;
                                                  pcVar5 = "(*substring).buffer == (\"z\")";
                                                  pcVar6 = "(*substring).buffer";
                                                  }
                                                  }
                                                  else {
                                                    __s2 = "(8)";
                                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                                    pcVar4 = 
                                                  "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                                  pcVar5 = "(*substring).capacity == (8)";
                                                  pcVar6 = "(*substring).capacity";
                                                  string.size = pAVar2->capacity;
                                                  }
LAB_0014e242:
                                                  iVar1 = 0x9b1;
                                                  goto LAB_0014e37b;
                                                }
                                                string.size = 0x15c553;
                                              }
                                              expr = 
                                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                              ;
                                              pcVar4 = 
                                              "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                                              pcVar5 = "(string).buffer == (\"abcd01234567wxyz\")";
                                              pcVar6 = "(string).buffer";
                                            }
                                          }
                                          else {
                                            __s2 = "(16)";
                                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                                            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju"
                                            ;
                                            pcVar5 = "(string).capacity == (16)";
                                            pcVar6 = "(string).capacity";
                                            string.size = string.capacity;
                                          }
LAB_0014e0d3:
                                          iVar1 = 0x9ad;
                                          goto LAB_0014e37b;
                                        }
                                        string.size = 0x15c553;
                                      }
                                      expr = 
                                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                                      ;
                                      pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s"
                                      ;
                                      pcVar5 = "(*substring).buffer == (\"4567wxyz\")";
                                      pcVar6 = "(*substring).buffer";
                                    }
                                  }
                                  else {
                                    __s2 = "(8)";
                                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                                    pcVar5 = "(*substring).capacity == (8)";
                                    pcVar6 = "(*substring).capacity";
                                    string.size = pAVar2->capacity;
                                  }
LAB_0014df9f:
                                  iVar1 = 0x9ac;
                                  goto LAB_0014e37b;
                                }
                                string.size = 0x15c553;
                              }
                              expr = 
                              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                              ;
                              pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                              pcVar5 = "(string).buffer == (\"abcd01234567wxyz\")";
                              pcVar6 = "(string).buffer";
                            }
                          }
                          else {
                            __s2 = "(16)";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar5 = "(string).capacity == (16)";
                            pcVar6 = "(string).capacity";
                            string.size = string.capacity;
                          }
LAB_0014de30:
                          iVar1 = 0x9a8;
                          goto LAB_0014e37b;
                        }
                        string.size = 0x15c553;
                      }
                      expr = 
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ;
                      pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                      pcVar5 = "(*substring).buffer == (\"abcd01234567wxyz\")";
                      pcVar6 = "(*substring).buffer";
                    }
                  }
                  else {
                    __s2 = "(16)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar5 = "(*substring).capacity == (16)";
                    pcVar6 = "(*substring).capacity";
                    string.size = pAVar2->capacity;
                  }
LAB_0014dcfc:
                  iVar1 = 0x9a7;
                  goto LAB_0014e37b;
                }
                string.size = 0x15c553;
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar5 = "(string).buffer == (\"abcd01234567wxyz\")";
              pcVar6 = "(string).buffer";
            }
          }
          else {
            __s2 = "(16)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar5 = "(string).capacity == (16)";
            pcVar6 = "(string).capacity";
            string.size = string.capacity;
          }
LAB_0014db94:
          iVar1 = 0x9a3;
          goto LAB_0014e37b;
        }
        string.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar4 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar5 = "(*substring).buffer == (\"abcd01234567wxyz\")";
      pcVar6 = "(*substring).buffer";
    }
  }
  else {
    __s2 = "(16)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar5 = "(*substring).capacity == (16)";
    pcVar6 = "(*substring).capacity";
    string.size = pAVar2->capacity;
  }
LAB_0014da60:
  iVar1 = 0x9a2;
LAB_0014e37b:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar1,expr,pcVar4,pcVar5,pcVar6,string.size,__s2);
}

Assistant:

END_TEST
START_TEST(test_AString_substring_rangeBeyondBounds)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("abcd01234567wxyz", 16);
    struct AString *substring;
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    substring = AString_substring(&string, 0, 17);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "abcd01234567wxyz", 16);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "abcd01234567wxyz", 16);
    AString_destruct(substring);
    substring = AString_substring(&string, 0, -1);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "abcd01234567wxyz", 16);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "abcd01234567wxyz", 16);
    AString_destruct(substring);
    substring = AString_substring(&string, 8, -1);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "4567wxyz", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "abcd01234567wxyz", 16);
    AString_destruct(substring);
    substring = AString_substring(&string, 15, 666);
    ACUTILSTEST_ASSERT_PTR_NONNULL(substring);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(*substring, "z", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "abcd01234567wxyz", 16);
    AString_destruct(substring);
    private_ACUtilsTest_AString_destructTestString(string);
}